

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

PackedFunc * __thiscall
tvm::runtime::TVMArgValue::operator_cast_to_PackedFunc
          (PackedFunc *__return_storage_ptr__,TVMArgValue *this)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  PackedFunc *pPVar5;
  LogMessageFatal local_1b0;
  anon_enum_32 local_24;
  LogCheckError local_20;
  LogCheckError _check_err;
  TVMArgValue *this_local;
  
  _check_err.str = (string *)this;
  if ((this->super_TVMPODValue_).type_code_ == 4) {
    PackedFunc::PackedFunc(__return_storage_ptr__);
  }
  else {
    local_24 = kFuncHandle;
    dmlc::LogCheck_EQ<int,TVMTypeCode>
              ((dmlc *)&local_20,&(this->super_TVMPODValue_).type_code_,&local_24);
    bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_20);
    if (bVar1) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x243);
      poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1b0);
      poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"type_code_ == kFuncHandle");
      poVar3 = std::operator<<(poVar3,(string *)local_20.str);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3," expected ");
      pcVar4 = TypeCode2Str(10);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3," but get ");
      pcVar4 = TypeCode2Str((this->super_TVMPODValue_).type_code_);
      std::operator<<(poVar3,pcVar4);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    dmlc::LogCheckError::~LogCheckError(&local_20);
    pPVar5 = TVMPODValue_::ptr<tvm::runtime::PackedFunc>(&this->super_TVMPODValue_);
    PackedFunc::PackedFunc(__return_storage_ptr__,pPVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

operator PackedFunc() const {
    if (type_code_ == kNull)
      return PackedFunc();
    TVM_CHECK_TYPE_CODE(type_code_, kFuncHandle);
    return *ptr<PackedFunc>();
  }